

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_hash.cpp
# Opt level: O0

void fillAes1Rx4<false>(void *state,size_t outputSize,void *buffer)

{
  undefined8 *puVar1;
  undefined8 *in_RDX;
  long in_RSI;
  long lVar2;
  undefined8 *in_RDI;
  undefined8 *puVar3;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  rx_vec_i128 in;
  rx_vec_i128 in_00;
  rx_vec_i128 in_01;
  rx_vec_i128 key;
  rx_vec_i128 key_00;
  rx_vec_i128 key_01;
  rx_vec_i128 key_02;
  rx_vec_i128 alVar4;
  rx_vec_i128 key3;
  rx_vec_i128 key2;
  rx_vec_i128 key1;
  rx_vec_i128 key0;
  rx_vec_i128 state3;
  rx_vec_i128 state2;
  rx_vec_i128 state1;
  rx_vec_i128 state0;
  uint8_t *outputEnd;
  uint8_t *outptr;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 *local_1b8;
  
  puVar1 = (undefined8 *)((long)in_RDX + in_RSI);
  local_1d8 = *in_RDI;
  uStack_1d0 = in_RDI[1];
  local_1e8 = in_RDI[2];
  uStack_1e0 = in_RDI[3];
  local_1f8 = in_RDI[4];
  uStack_1f0 = in_RDI[5];
  local_208 = in_RDI[6];
  uStack_200 = in_RDI[7];
  lVar2 = in_RSI;
  puVar3 = in_RDI;
  for (local_1b8 = in_RDX; local_1b8 < puVar1; local_1b8 = local_1b8 + 8) {
    alVar4[1] = lVar2;
    alVar4[0] = (longlong)puVar3;
    key[1] = in_RSI;
    key[0] = (longlong)in_RDX;
    alVar4 = aesdec<false>(alVar4,key);
    key_00[0] = alVar4[1];
    in[1] = lVar2;
    in[0] = (longlong)puVar3;
    key_00[1] = in_RSI;
    alVar4 = aesenc<false>(in,key_00);
    key_01[0] = alVar4[1];
    in_00[1] = lVar2;
    in_00[0] = (longlong)puVar3;
    key_01[1] = in_RSI;
    alVar4 = aesdec<false>(in_00,key_01);
    key_02[0] = alVar4[1];
    in_01[1] = lVar2;
    in_01[0] = (longlong)puVar3;
    key_02[1] = in_RSI;
    alVar4 = aesenc<false>(in_01,key_02);
    in_RDX = alVar4[1];
    *local_1b8 = extraout_XMM0_Qa;
    local_1b8[1] = extraout_XMM0_Qb;
    local_1b8[2] = extraout_XMM0_Qa_00;
    local_1b8[3] = extraout_XMM0_Qb_00;
    local_1b8[4] = extraout_XMM0_Qa_01;
    local_1b8[5] = extraout_XMM0_Qb_01;
    local_1b8[6] = extraout_XMM0_Qa_02;
    local_1b8[7] = extraout_XMM0_Qb_02;
    local_208 = extraout_XMM0_Qa_02;
    uStack_200 = extraout_XMM0_Qb_02;
    local_1f8 = extraout_XMM0_Qa_01;
    uStack_1f0 = extraout_XMM0_Qb_01;
    local_1e8 = extraout_XMM0_Qa_00;
    uStack_1e0 = extraout_XMM0_Qb_00;
    local_1d8 = extraout_XMM0_Qa;
    uStack_1d0 = extraout_XMM0_Qb;
  }
  *in_RDI = local_1d8;
  in_RDI[1] = uStack_1d0;
  in_RDI[2] = local_1e8;
  in_RDI[3] = uStack_1e0;
  in_RDI[4] = local_1f8;
  in_RDI[5] = uStack_1f0;
  in_RDI[6] = local_208;
  in_RDI[7] = uStack_200;
  return;
}

Assistant:

void fillAes1Rx4(void *state, size_t outputSize, void *buffer) {
	assert(outputSize % 64 == 0);
	const uint8_t* outptr = (uint8_t*)buffer;
	const uint8_t* outputEnd = outptr + outputSize;

	rx_vec_i128 state0, state1, state2, state3;
	rx_vec_i128 key0, key1, key2, key3;

	key0 = rx_set_int_vec_i128(AES_GEN_1R_KEY0);
	key1 = rx_set_int_vec_i128(AES_GEN_1R_KEY1);
	key2 = rx_set_int_vec_i128(AES_GEN_1R_KEY2);
	key3 = rx_set_int_vec_i128(AES_GEN_1R_KEY3);

	state0 = rx_load_vec_i128((rx_vec_i128*)state + 0);
	state1 = rx_load_vec_i128((rx_vec_i128*)state + 1);
	state2 = rx_load_vec_i128((rx_vec_i128*)state + 2);
	state3 = rx_load_vec_i128((rx_vec_i128*)state + 3);

	while (outptr < outputEnd) {
		state0 = aesdec<softAes>(state0, key0);
		state1 = aesenc<softAes>(state1, key1);
		state2 = aesdec<softAes>(state2, key2);
		state3 = aesenc<softAes>(state3, key3);

		rx_store_vec_i128((rx_vec_i128*)outptr + 0, state0);
		rx_store_vec_i128((rx_vec_i128*)outptr + 1, state1);
		rx_store_vec_i128((rx_vec_i128*)outptr + 2, state2);
		rx_store_vec_i128((rx_vec_i128*)outptr + 3, state3);

		outptr += 64;
	}

	rx_store_vec_i128((rx_vec_i128*)state + 0, state0);
	rx_store_vec_i128((rx_vec_i128*)state + 1, state1);
	rx_store_vec_i128((rx_vec_i128*)state + 2, state2);
	rx_store_vec_i128((rx_vec_i128*)state + 3, state3);
}